

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O2

void __thiscall ChatClient::ChatClient(ChatClient *this,QObject *parent)

{
  QTcpSocket *pQVar1;
  undefined4 *puVar2;
  ConnectionType type;
  ulong uVar3;
  code *local_50;
  undefined8 uStack_48;
  QObject local_40 [8];
  Object local_38 [8];
  Object local_30 [8];
  Object local_28 [8];
  Object local_20 [8];
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_0010e9c0;
  pQVar1 = (QTcpSocket *)operator_new(0x10);
  QTcpSocket::QTcpSocket(pQVar1,&this->super_QObject);
  this->m_clientSocket = pQVar1;
  this->m_loggedIn = false;
  local_50 = connected;
  uStack_48 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QAbstractSocket::*)(),void(ChatClient::*)()>
            (local_20,(offset_in_QAbstractSocket_to_subr)pQVar1,(Object *)QAbstractSocket::connected
             ,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_20);
  local_50 = disconnected;
  uStack_48 = 0;
  QObject::connect<void(QAbstractSocket::*)(),void(ChatClient::*)()>
            (local_28,(offset_in_QAbstractSocket_to_subr)this->m_clientSocket,
             (Object *)QAbstractSocket::disconnected,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  local_50 = onReadyRead;
  uStack_48 = 0;
  QObject::connect<void(QIODevice::*)(),void(ChatClient::*)()>
            (local_30,(offset_in_QIODevice_to_subr)this->m_clientSocket,
             (Object *)QIODevice::readyRead,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  local_50 = error;
  uStack_48 = 0;
  uVar3 = 0;
  QObject::
  connect<void(QAbstractSocket::*)(QAbstractSocket::SocketError),void(ChatClient::*)(QAbstractSocket::SocketError)>
            (local_38,(offset_in_QAbstractSocket_to_subr)this->m_clientSocket,
             (Object *)QAbstractSocket::errorOccurred,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pQVar1 = this->m_clientSocket;
  local_50 = QAbstractSocket::disconnected;
  uStack_48 = 0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]ChatExample/QtSimpleChatClient/chatclient.cpp:26:62),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ChatClient **)(puVar2 + 4) = this;
  QObject::connectImpl
            (local_40,(void **)pQVar1,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar2,(int *)(uVar3 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  return;
}

Assistant:

ChatClient::ChatClient(QObject *parent)
    : QObject(parent)
    , m_clientSocket(new QTcpSocket(this))
    , m_loggedIn(false)
{
    // Forward the connected and disconnected signals
    connect(m_clientSocket, &QTcpSocket::connected, this, &ChatClient::connected);
    connect(m_clientSocket, &QTcpSocket::disconnected, this, &ChatClient::disconnected);
    // connect readyRead() to the slot that will take care of reading the data in
    connect(m_clientSocket, &QTcpSocket::readyRead, this, &ChatClient::onReadyRead);
    // Forward the error signal, QOverload is necessary as error() is overloaded, see the Qt docs 
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    connect(m_clientSocket, QOverload<QAbstractSocket::SocketError>::of(&QAbstractSocket::error), this, &ChatClient::error);
#else
    connect(m_clientSocket, &QAbstractSocket::errorOccurred, this, &ChatClient::error);
#endif
    // Reset the m_loggedIn variable when we disconnec. Since the operation is trivial we use a lambda instead of creating another slot
    connect(m_clientSocket, &QTcpSocket::disconnected, this, [this]()->void{m_loggedIn = false;});
}